

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::DeepScanLineInputFile::Data::Data(Data *this,Context *ctxt,int pN,int nT)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Compression in_stack_0000000c;
  LineOrder in_stack_00000010;
  float in_stack_00000014;
  V2f *in_stack_00000018;
  float in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  Vec2<float> in_stack_ffffffffffffffe0;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0xc) = in_ECX;
  Imath_3_2::Vec2<float>::Vec2((Vec2<float> *)&stack0xffffffffffffffe0,0.0,0.0);
  Header::Header((Header *)CONCAT44(pN,nT),in_stack_0000002c,in_stack_00000028,in_stack_00000024,
                 in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c);
  *(undefined1 *)(in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0x51) = 0;
  DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)in_stack_ffffffffffffffe0);
  std::vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>::vector
            ((vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *)0x1ab805);
  std::mutex::mutex((mutex *)0x1ab816);
  return;
}

Assistant:

Data (Context *ctxt, int pN, int nT)
    : _ctxt (ctxt)
    , partNumber (pN)
    , numThreads (nT)
    {}